

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

int __thiscall
kratos::Stmt::clone(Stmt *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  __shared_ptr<kratos::Stmt_const,(__gnu_cxx::_Lock_policy)2> local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<kratos::Stmt_const,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Stmt,void>
            (local_28,(__weak_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)(__fn + 0x68));
  std::const_pointer_cast<kratos::Stmt,kratos::Stmt_const>((shared_ptr<const_kratos::Stmt> *)this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  return (int)this;
}

Assistant:

std::shared_ptr<Stmt> Stmt::clone() const {
    return std::const_pointer_cast<Stmt>(shared_from_this());
}